

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int wally_elements_pegout_script_size
              (size_t genesis_blockhash_len,size_t mainchain_script_len,size_t sub_pubkey_len,
              size_t whitelistproof_len,size_t *written)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = 1;
  lVar2 = lVar1;
  if (0x4b < genesis_blockhash_len) {
    if (genesis_blockhash_len < 0x100) {
      lVar2 = 2;
    }
    else {
      lVar2 = (ulong)(0xffff < genesis_blockhash_len) * 2 + 3;
    }
  }
  lVar3 = lVar1;
  if (0x4b < mainchain_script_len) {
    if (mainchain_script_len < 0x100) {
      lVar3 = 2;
    }
    else {
      lVar3 = (ulong)(0xffff < mainchain_script_len) * 2 + 3;
    }
  }
  lVar4 = lVar1;
  if (0x4b < sub_pubkey_len) {
    if (sub_pubkey_len < 0x100) {
      lVar4 = 2;
    }
    else {
      lVar4 = (ulong)(0xffff < sub_pubkey_len) * 2 + 3;
    }
  }
  if (0x4b < whitelistproof_len) {
    if (whitelistproof_len < 0x100) {
      lVar1 = 2;
    }
    else {
      lVar1 = (ulong)(0xffff < whitelistproof_len) * 2 + 3;
    }
  }
  *written = lVar1 + lVar2 + lVar3 +
                     sub_pubkey_len + whitelistproof_len +
                     genesis_blockhash_len + mainchain_script_len + lVar4 + 1;
  return 0;
}

Assistant:

int wally_elements_pegout_script_size(size_t genesis_blockhash_len,
                                      size_t mainchain_script_len,
                                      size_t sub_pubkey_len,
                                      size_t whitelistproof_len,
                                      size_t *written)
{
    *written = 1
               + script_get_push_size(genesis_blockhash_len)
               + script_get_push_size(mainchain_script_len)
               + script_get_push_size(sub_pubkey_len)
               + script_get_push_size(whitelistproof_len);
    return WALLY_OK;
}